

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall QTableWidget::insertColumn(QTableWidget *this,int column)

{
  long lVar1;
  QTableModel *pQVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QTableWidgetPrivate::tableModel
                     (*(QTableWidgetPrivate **)
                       &(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.
                        super_QFrame.super_QWidget.field_0x8);
  (**(code **)(*(long *)pQVar2 + 0x100))(pQVar2,column,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidget::insertColumn(int column)
{
    Q_D(QTableWidget);
    d->tableModel()->insertColumns(column);
}